

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O3

void __thiscall asl::Date::Date(Date *this,String *t)

{
  char cVar1;
  Date *pDVar2;
  uint uVar3;
  int iVar4;
  anon_union_16_2_78e7fdac_for_String_2 *paVar5;
  Map<asl::String,_int> *pMVar6;
  int x_9;
  uint uVar7;
  int iVar8;
  int x_8;
  uint m;
  int x_4;
  uint uVar9;
  Zone z;
  ulong uVar10;
  byte bVar11;
  ulong uVar12;
  long lVar13;
  int x;
  uint uVar14;
  long lVar15;
  int x_1;
  int iVar16;
  int x_2;
  uint s;
  int m_00;
  ulong uVar17;
  int x_3;
  int s_00;
  byte *pbVar18;
  int x_7;
  int x_5;
  uint month;
  int x_6;
  uint day;
  bool bVar19;
  double dVar20;
  double dVar21;
  Array<asl::String> parts;
  Array<asl::Map<asl::String,_int>::KeyVal> local_1a0;
  double local_198;
  byte *local_190;
  Date *local_188;
  String local_180;
  String local_168;
  String local_150;
  String local_138;
  String local_120;
  String local_108;
  String local_f0;
  String local_d8;
  String local_c0;
  String local_a8;
  String local_90;
  String local_78;
  int local_60 [12];
  
  if (nan()::n == '\0') {
    asl::Date();
  }
  this->_t = (double)nan()::n;
  paVar5 = &t->field_2;
  if (t->_size != 0) {
    paVar5 = (anon_union_16_2_78e7fdac_for_String_2 *)(t->field_2)._str;
  }
  if ((byte)(paVar5->_space[0] + 0xbeU) < 0x18) {
    String::split((String *)&parts);
    if (5 < *(int *)&parts._a[-1].field_2) {
      if ((Date(asl::String_const&)::months == '\0') &&
         (iVar4 = __cxa_guard_acquire(&Date(asl::String_const&)::months), iVar4 != 0)) {
        String::String(&local_78,"Jan");
        local_60[0xb] = 1;
        Map<asl::String,_int>::Map((Map<asl::String,_int> *)&local_1a0,&local_78,local_60 + 0xb);
        String::String(&local_90,"Feb");
        local_60[10] = 2;
        pMVar6 = Map<asl::String,_int>::set
                           ((Map<asl::String,_int> *)&local_1a0,&local_90,local_60 + 10);
        String::String(&local_a8,"Mar");
        local_60[9] = 3;
        pMVar6 = Map<asl::String,_int>::set(pMVar6,&local_a8,local_60 + 9);
        String::String(&local_c0,"Apr");
        local_60[8] = 4;
        pMVar6 = Map<asl::String,_int>::set(pMVar6,&local_c0,local_60 + 8);
        String::String(&local_d8,"May");
        local_60[7] = 5;
        pMVar6 = Map<asl::String,_int>::set(pMVar6,&local_d8,local_60 + 7);
        String::String(&local_f0,"Jun");
        local_60[6] = 6;
        pMVar6 = Map<asl::String,_int>::set(pMVar6,&local_f0,local_60 + 6);
        String::String(&local_108,"Jul");
        local_60[5] = 7;
        pMVar6 = Map<asl::String,_int>::set(pMVar6,&local_108,local_60 + 5);
        String::String(&local_120,"Aug");
        local_60[4] = 8;
        pMVar6 = Map<asl::String,_int>::set(pMVar6,&local_120,local_60 + 4);
        String::String(&local_138,"Sep");
        local_60[3] = 9;
        pMVar6 = Map<asl::String,_int>::set(pMVar6,&local_138,local_60 + 3);
        String::String(&local_150,"Oct");
        local_60[2] = 10;
        pMVar6 = Map<asl::String,_int>::set(pMVar6,&local_150,local_60 + 2);
        String::String(&local_168,"Nov");
        local_60[1] = 0xb;
        pMVar6 = Map<asl::String,_int>::set(pMVar6,&local_168,local_60 + 1);
        String::String(&local_180,"Dec");
        local_60[0] = 0xc;
        pMVar6 = Map<asl::String,_int>::set(pMVar6,&local_180,local_60);
        Date::months.a._a = (Array<asl::Map<asl::String,_int>::KeyVal>)(pMVar6->a)._a;
        LOCK();
        ((KeyVal *)((long)Date::months.a._a + -0x20))->value =
             ((KeyVal *)((long)Date::months.a._a + -0x20))->value + 1;
        UNLOCK();
        if (local_180._size != 0) {
          free(local_180.field_2._str);
        }
        if (local_168._size != 0) {
          free(local_168.field_2._str);
        }
        if (local_150._size != 0) {
          free(local_150.field_2._str);
        }
        if (local_138._size != 0) {
          free(local_138.field_2._str);
        }
        if (local_120._size != 0) {
          free(local_120.field_2._str);
        }
        if (local_108._size != 0) {
          free(local_108.field_2._str);
        }
        if (local_f0._size != 0) {
          free(local_f0.field_2._str);
        }
        if (local_d8._size != 0) {
          free(local_d8.field_2._str);
        }
        if (local_c0._size != 0) {
          free(local_c0.field_2._str);
        }
        if (local_a8._size != 0) {
          free(local_a8.field_2._str);
        }
        if (local_90._size != 0) {
          free(local_90.field_2._str);
        }
        Array<asl::Map<asl::String,_int>::KeyVal>::~Array(&local_1a0);
        if (local_78._size != 0) {
          free(local_78.field_2._str);
        }
        __cxa_atexit(Map<asl::String,_int>::~Map,&Date::months,&__dso_handle);
        __cxa_guard_release(&Date(asl::String_const&)::months);
      }
      uVar3 = Map<asl::String,_int>::indexOf(&Date::months,parts._a + 2);
      if ((int)uVar3 < 0) {
        iVar4 = 0;
      }
      else {
        iVar4 = *(int *)((long)Date::months.a._a + 0x18 + (ulong)uVar3 * 0x20);
      }
      if (parts._a[1]._size == 0) {
        paVar5 = &parts._a[1].field_2;
      }
      else {
        paVar5 = (anon_union_16_2_78e7fdac_for_String_2 *)parts._a[1].field_2._str;
      }
      uVar3 = 0;
      iVar8 = 1;
      uVar12 = 3;
      do {
        if (9 < (byte)(paVar5->_space[uVar12 - 2] - 0x30U)) {
          uVar3 = 0xfff0bdc0;
          break;
        }
        uVar3 = uVar3 + ((byte)paVar5->_space[uVar12 - 2] - 0x30) * iVar8;
        iVar8 = iVar8 * 10;
        uVar12 = uVar12 - 1;
      } while (1 < uVar12);
      if (parts._a[3]._size == 0) {
        paVar5 = &parts._a[3].field_2;
      }
      else {
        paVar5 = (anon_union_16_2_78e7fdac_for_String_2 *)parts._a[3].field_2._str;
      }
      if ((long)parts._a[3]._len < 1) {
        uVar7 = 0;
      }
      else {
        uVar12 = (long)parts._a[3]._len + 1;
        uVar7 = 0;
        iVar8 = 1;
        do {
          if (9 < (byte)(paVar5->_space[uVar12 - 2] - 0x30U)) {
            uVar7 = 0xfff0bdc0;
            break;
          }
          uVar7 = uVar7 + ((byte)paVar5->_space[uVar12 - 2] - 0x30) * iVar8;
          iVar8 = iVar8 * 10;
          uVar12 = uVar12 - 1;
        } while (1 < uVar12);
      }
      if ((iVar4 != 0) && (-1 < (int)(uVar7 | uVar3))) {
        if (parts._a[4]._size == 0) {
          paVar5 = &parts._a[4].field_2;
        }
        else {
          paVar5 = (anon_union_16_2_78e7fdac_for_String_2 *)parts._a[4].field_2._str;
        }
        if (((parts._a[4]._len == 8) && (paVar5->_space[2] == ':')) && (paVar5->_space[5] == ':')) {
          iVar16 = 0;
          iVar8 = 1;
          uVar12 = 3;
          do {
            if (9 < (byte)(paVar5->_space[uVar12 - 2] - 0x30U)) {
              iVar16 = -1000000;
              break;
            }
            iVar16 = iVar16 + ((byte)paVar5->_space[uVar12 - 2] - 0x30) * iVar8;
            iVar8 = iVar8 * 10;
            uVar12 = uVar12 - 1;
          } while (1 < uVar12);
          m_00 = 0;
          iVar8 = 1;
          uVar12 = 3;
          do {
            if (9 < (byte)(paVar5->_space[uVar12 + 1] - 0x30U)) {
              m_00 = -1000000;
              break;
            }
            m_00 = m_00 + ((byte)paVar5->_space[uVar12 + 1] - 0x30) * iVar8;
            iVar8 = iVar8 * 10;
            uVar12 = uVar12 - 1;
          } while (1 < uVar12);
          s_00 = 0;
          iVar8 = 1;
          uVar12 = 3;
          do {
            if (9 < (byte)(paVar5->_space[uVar12 + 4] - 0x30U)) {
              s_00 = -1000000;
              break;
            }
            s_00 = s_00 + ((byte)paVar5->_space[uVar12 + 4] - 0x30) * iVar8;
            iVar8 = iVar8 * 10;
            uVar12 = uVar12 - 1;
          } while (1 < uVar12);
          construct(this,UTC,uVar7,iVar4,uVar3,iVar16,m_00,s_00);
        }
      }
    }
    Array<asl::String>::~Array(&parts);
    return;
  }
  iVar4 = t->_len;
  if (iVar4 < 10) {
    bVar11 = 1;
    if (iVar4 < 8) {
      return;
    }
  }
  else if ((paVar5->_space[4] == '-') && (paVar5->_space[7] == '-')) {
    bVar11 = 0;
  }
  else {
    bVar11 = 1;
  }
  uVar3 = 0;
  iVar8 = 1;
  uVar12 = 5;
  do {
    if (9 < (byte)(paVar5->_space[uVar12 - 2] - 0x30U)) {
      uVar3 = 0xfff0bdc0;
      break;
    }
    uVar3 = uVar3 + ((byte)paVar5->_space[uVar12 - 2] - 0x30) * iVar8;
    iVar8 = iVar8 * 10;
    uVar12 = uVar12 - 1;
  } while (1 < uVar12);
  uVar7 = bVar11 ^ 5;
  month = 0;
  iVar8 = 1;
  uVar12 = 3;
  do {
    if (9 < (byte)(paVar5->_space[uVar12 + ((ulong)uVar7 - 2)] - 0x30U)) {
      month = 0xfff0bdc0;
      break;
    }
    month = month + ((byte)paVar5->_space[uVar12 + ((ulong)uVar7 - 2)] - 0x30) * iVar8;
    iVar8 = iVar8 * 10;
    uVar12 = uVar12 - 1;
  } while (1 < uVar12);
  uVar12 = (ulong)(bVar11 ^ 1) * 2 + 6;
  day = 0;
  iVar8 = 1;
  uVar17 = 3;
  do {
    if (9 < (byte)(paVar5->_space[uVar17 + (ulong)(bVar11 ^ 1) * 2 + 4] - 0x30U)) {
      day = 0xfff0bdc0;
      break;
    }
    day = day + ((byte)paVar5->_space[uVar17 + (ulong)(bVar11 ^ 1) * 2 + 4] - 0x30) * iVar8;
    iVar8 = iVar8 * 10;
    uVar17 = uVar17 - 1;
  } while (1 < uVar17);
  if (bVar11 == 0) {
    if (iVar4 < 0x10) {
      return;
    }
    uVar14 = 0xb;
    cVar1 = paVar5->_space[10];
  }
  else {
    if (iVar4 < 0xd) {
      return;
    }
    uVar14 = 9;
    cVar1 = paVar5->_space[8];
  }
  if (cVar1 != 'T') {
    return;
  }
  if ((int)(month | uVar3 | day) < 0) {
    return;
  }
  uVar9 = iVar4 - uVar14;
  local_188 = this;
  if ((int)uVar9 < (int)uVar7) {
    dVar21 = 0.0;
    z = UTC;
    uVar9 = 0;
    m = 0;
    s = 0;
    dVar20 = 0.0;
    goto LAB_00136bf6;
  }
  if (bVar11 == 0) {
    if (paVar5->_space[(ulong)uVar14 + 2] != ':') {
      return;
    }
    lVar15 = 3;
    lVar13 = 6;
    if (uVar9 < 8) goto LAB_00136dc6;
    bVar19 = paVar5->_space[(ulong)uVar14 + 5] == ':';
  }
  else {
    lVar15 = 2;
    lVar13 = 4;
    if (uVar9 < 6) {
LAB_00136dc6:
      bVar19 = false;
    }
    else {
      bVar19 = (byte)(paVar5->_space[(ulong)uVar14 + 4] - 0x30U) < 10;
    }
  }
  uVar9 = 0;
  iVar4 = 1;
  uVar17 = 3;
  do {
    if (9 < (byte)(paVar5->_space[uVar17 + ((ulong)uVar14 - 2)] - 0x30U)) {
      uVar9 = 0xfff0bdc0;
      break;
    }
    uVar9 = uVar9 + ((byte)paVar5->_space[uVar17 + ((ulong)uVar14 - 2)] - 0x30) * iVar4;
    iVar4 = iVar4 * 10;
    uVar17 = uVar17 - 1;
  } while (1 < uVar17);
  m = 0;
  iVar4 = 1;
  uVar17 = 3;
  do {
    if (9 < (byte)(paVar5->_space[uVar17 + lVar15 + (ulong)uVar14 + -2] - 0x30U)) {
      m = 0xfff0bdc0;
      break;
    }
    m = m + ((byte)paVar5->_space[uVar17 + lVar15 + (ulong)uVar14 + -2] - 0x30) * iVar4;
    iVar4 = iVar4 * 10;
    uVar17 = uVar17 - 1;
  } while (1 < uVar17);
  s = 0;
  uVar17 = (ulong)uVar7;
  if (bVar19) {
    s = 0;
    iVar4 = 1;
    uVar10 = 3;
    do {
      uVar17 = uVar12;
      if (9 < (byte)(paVar5->_space[uVar10 + lVar13 + (ulong)uVar14 + -2] - 0x30U)) {
        s = 0xfff0bdc0;
        break;
      }
      s = s + ((byte)paVar5->_space[uVar10 + lVar13 + (ulong)uVar14 + -2] - 0x30) * iVar4;
      iVar4 = iVar4 * 10;
      uVar10 = uVar10 - 1;
    } while (1 < uVar10);
  }
  pbVar18 = (byte *)(paVar5->_space + uVar17 + uVar14);
  dVar20 = 0.0;
  if (paVar5->_space[uVar17 + uVar14] == '.') {
    uVar7 = 0xffffffff;
    uVar12 = 0;
    do {
      lVar13 = uVar12 + 1;
      uVar7 = uVar7 + 1;
      uVar12 = uVar12 + 1;
    } while ((byte)(pbVar18[lVar13] - 0x30) < 10);
    local_198 = 0.0;
    if (1 < uVar12) {
      uVar17 = (ulong)uVar7 + 1;
      iVar8 = 0;
      iVar4 = 1;
      do {
        if (9 < (byte)(pbVar18[uVar17 - 1] - 0x30)) {
          iVar8 = -1000000;
          break;
        }
        iVar8 = iVar8 + (pbVar18[uVar17 - 1] - 0x30) * iVar4;
        iVar4 = iVar4 * 10;
        uVar17 = uVar17 - 1;
      } while (1 < uVar17);
      local_198 = (double)iVar8;
    }
    local_190 = pbVar18 + uVar12;
    dVar20 = pow(10.0,(double)(int)-uVar7);
    dVar20 = dVar20 * local_198;
    pbVar18 = local_190;
  }
  if (0x17 < uVar9) {
    return;
  }
  if (0x3b < m) {
    return;
  }
  if (0x3b < s) {
    return;
  }
  dVar21 = 0.0;
  if (dVar20 < 0.0) {
    return;
  }
  bVar11 = *pbVar18;
  if (bVar11 < 0x2d) {
    if (bVar11 == 0) {
      z = LOCAL;
      goto LAB_00136bf6;
    }
    if (bVar11 != 0x2b) {
      return;
    }
LAB_0013703d:
    iVar4 = (int)&t->field_2;
    if (t->_size != 0) {
      iVar4 = *(int *)&t->field_2;
    }
    iVar8 = (iVar4 + t->_len) - (int)pbVar18;
    iVar4 = 0;
    if (2 < iVar8) {
      iVar4 = 0;
      iVar16 = 1;
      uVar12 = 3;
      do {
        if (9 < (byte)(pbVar18[uVar12 - 1] - 0x30)) {
          iVar4 = -1000000;
          break;
        }
        iVar4 = iVar4 + (pbVar18[uVar12 - 1] - 0x30) * iVar16;
        iVar16 = iVar16 * 10;
        uVar12 = uVar12 - 1;
      } while (1 < uVar12);
      iVar4 = iVar4 * 0x3c;
    }
    if (iVar8 != 3) {
      if (iVar8 == 5) {
        iVar16 = 0;
        iVar8 = 1;
        uVar12 = 3;
        do {
          if (9 < (byte)(pbVar18[uVar12 + 1] - 0x30)) goto LAB_00137137;
          iVar16 = iVar16 + (pbVar18[uVar12 + 1] - 0x30) * iVar8;
          iVar8 = iVar8 * 10;
          uVar12 = uVar12 - 1;
        } while (1 < uVar12);
      }
      else {
        if (iVar8 != 6) {
          return;
        }
        if (pbVar18[3] != 0x3a) {
          return;
        }
        iVar16 = 0;
        iVar8 = 1;
        uVar12 = 3;
        do {
          if (9 < (byte)(pbVar18[uVar12 + 2] - 0x30)) goto LAB_00137137;
          iVar16 = iVar16 + (pbVar18[uVar12 + 2] - 0x30) * iVar8;
          iVar8 = iVar8 * 10;
          uVar12 = uVar12 - 1;
        } while (1 < uVar12);
      }
      goto LAB_0013713c;
    }
    goto LAB_0013713e;
  }
  if (bVar11 != 0x5a) {
    if (bVar11 != 0x2d) {
      return;
    }
    goto LAB_0013703d;
  }
LAB_0013715d:
  z = UTC;
LAB_00136bf6:
  pDVar2 = local_188;
  construct(local_188,z,uVar3,month,day,uVar9,m,s);
  pDVar2->_t = dVar21 + dVar20 + pDVar2->_t;
  return;
LAB_00137137:
  iVar16 = -1000000;
LAB_0013713c:
  iVar4 = iVar4 + iVar16;
LAB_0013713e:
  if (iVar4 < -100000) {
    return;
  }
  iVar8 = -iVar4;
  if (bVar11 != 0x2b) {
    iVar8 = iVar4;
  }
  dVar21 = (double)(iVar8 * 0x3c);
  goto LAB_0013715d;
}

Assistant:

Date::Date(const String& t)
{
	_t = nan();
	if (t[0] > 'A' && t[0] < 'Z') // HTTP like? "Thu, 18 May 2017 03:24:12 GMT"
	{
		Array<String> parts = t.split();
		if (parts.length() < 6)
			return;
		
		static Map<String, int> months = Map<String, int>("Jan", 1)("Feb", 2)(
		    "Mar", 3)("Apr", 4)("May", 5)("Jun", 6)("Jul", 7)("Aug", 8)("Sep", 9)("Oct", 10)("Nov", 11)("Dec", 12);
		
		int mo = months.get(parts[2], 0);
		int d = parseInt(parts[1], 2);
		int y = parseInt(parts[3], parts[3].length());
		if (mo == 0 || y < 0 || d < 0)
			return;
		const char* time = parts[4];
		if (parts[4].length() != 8 || time[2] != ':' || time[5] != ':')
			return;
		int h = parseInt(time, 2);
		int m = parseInt(time + 3, 2);
		int s = parseInt(time + 6, 2);
		construct(UTC, y, mo, d, h, m, s);
		return;
	}
	const char* p = t.data();
	int         y = -1, m = 1, d = 1;
	int         iTime = 0;
	bool        basic = true, local = false, hassecs = false;

	if (t.length() >= 10 && p[4] == '-' && p[7] == '-')
	{
		basic = false;
	}
	else if (t.length() < 8)
		return;

	y = parseInt(p + 0, 4);
	m = parseInt(p + (basic ? 4 : 5), 2);
	d = parseInt(p + (basic ? 6 : 8), 2);

	if (basic && t.length() > 12 && t[8] == 'T')
		iTime = 9;
	else if (!basic && t.length() > 15 && t[10] == 'T')
		iTime = 11;
	else
		return;

	if (y < 0 || m < 0 || d < 0)
		return;

	int    h = 0, mi = 0, s = 0, tz = 0;
	double ms = 0;

	if (iTime > 0)
		p = p + iTime;

	if (iTime > 0 && t.length() - iTime >= (basic ? 4 : 5)) // there is time
	{
		if (!basic) // ext
		{
			if (p[2] != ':')
				return;
			if (t.length() - iTime >= 8 && p[5] == ':')
				hassecs = true;
		}
		else // basic
		{
			if (t.length() - iTime >= 6 && myisdigit(p[4]))
				hassecs = true;
		}

		h = parseInt(p, 2);
		mi = parseInt(p + (basic ? 2 : 3), 2);
		s = parseInt(p + (basic ? 4 : 6), hassecs ? 2 : 0);
		p += hassecs ? (basic ? 6 : 8) : (basic ? 4 : 5);

		if (p[0] == '.') // have ms
		{
			int i = 1;
			while (myisdigit(p[i]))
				i++;
			ms = parseInt(p + 1, i - 1) * pow(10.0, 1-i);
			p += i;
		}

		if (h < 0 || h > 23 || mi < 0 || mi > 59 || s < 0 || s > 59 || ms < 0)
			return;

		if (p[0] == 'Z')
			tz = 0;
		else if (p[0] == '+' || p[0] == '-')
		{
			int n = int(t.data() + t.length() - p);
			if (n >= 3)
				tz = parseInt(p + 1, 2) * 60;
			if (n == 6 && p[3] == ':')
				tz += parseInt(p + 4, 2);
			else if (n == 5)
				tz += parseInt(p + 3, 2);
			else if (n != 3)
				tz = -1000000;

			if (tz < -100000)
				return;

			if (p[0] == '+')
				tz = -tz;
		}
		else if (p[0] == '\0')
			local = true;
		else
			return;
	}

	construct(local ? LOCAL : UTC, y, m, d, h, mi, s);

	_t += tz * 60 + ms;
}